

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkMissedBreak(CheckerVisitor *this,SwitchStatement *swtch)

{
  TreeOp TVar1;
  Block *n;
  Block *b;
  Statement *pSVar2;
  Node *n_00;
  SwitchCase *c;
  SwitchCase *pSVar3;
  long lVar4;
  bool r;
  CheckerVisitor *local_58;
  SwitchStatement *local_50;
  int32_t dummy;
  FunctionReturnTypeEvaluator rtEvaluator;
  
  if (this->effectsOnly == false) {
    rtEvaluator.flags = 0;
    pSVar3 = (swtch->_cases)._vals;
    n_00 = (Node *)0x0;
    local_58 = this;
    local_50 = swtch;
    rtEvaluator.checker = this;
    for (lVar4 = (ulong)(swtch->_cases)._size << 4; lVar4 != 0; lVar4 = lVar4 + -0x10) {
      if (n_00 != (Node *)0x0) {
        report(this,n_00,0x72);
      }
      n = (Block *)pSVar3->stmt;
      r = false;
      FunctionReturnTypeEvaluator::compute(&rtEvaluator,(Statement *)n,&r);
      if (r == false) {
        b = (Block *)unwrapBodyNonEmpty((Statement *)n);
        if (b != (Block *)0x0) {
          TVar1 = *(TreeOp *)&b->field_0x18;
          if (TVar1 == TO_BLOCK) {
            pSVar2 = lastNonEmpty(b,&dummy);
            if (pSVar2 == (Statement *)0x0) goto LAB_0014759a;
            TVar1 = (pSVar2->super_Node)._op;
            n = b;
          }
          if (TVar1 != TO_BREAK) {
            n_00 = &unwrapBody((Statement *)n)->super_Node;
            this = local_58;
            goto LAB_001475b4;
          }
        }
LAB_0014759a:
        n_00 = (Node *)0x0;
        this = local_58;
      }
      else {
        n_00 = (Node *)0x0;
      }
LAB_001475b4:
      pSVar3 = pSVar3 + 1;
    }
    if ((n_00 != (Node *)0x0) && ((local_50->_defaultCase).stmt != (Statement *)0x0)) {
      report(this,n_00,0x72);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkMissedBreak(const SwitchStatement *swtch) {
  if (effectsOnly)
    return;

  auto &cases = swtch->cases();

  FunctionReturnTypeEvaluator rtEvaluator(this);

  const Statement *last = nullptr;
  for (auto &c : cases) {

    if (last) {
      report(last, DiagnosticsId::DI_MISSED_BREAK);
    }
    last = nullptr;

    const Statement *stmt = c.stmt;
    bool r = false;
    rtEvaluator.compute(stmt, r);
    if (!r) {
      const Statement *uw = unwrapBodyNonEmpty(stmt);

      if (!uw)
        continue; // empty case statement -> FT

      const enum TreeOp op = uw->op();
      if (op != TO_BLOCK) {
        if (op != TO_BREAK)
          last = unwrapBody(stmt);
      }
      else {
        const Block *b = uw->asBlock();
        int32_t dummy;
        const Statement *tmp = lastNonEmpty(b, dummy);
        if (tmp && tmp->op() != TO_BREAK) {
          last = unwrapBody(b);
        }
      }
    }
  }

  if (last && swtch->defaultCase().stmt) {
    /*
      switch (x) {
        case A:
          ...
          break;

        case B:
          ...   <-- missed break
        default:
          ...
      }
    */
    report(last, DiagnosticsId::DI_MISSED_BREAK);
  }
}